

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_set_header(nni_list *l,char *n,char *v)

{
  int iVar1;
  char *v_local;
  char *n_local;
  nni_list *l_local;
  
  iVar1 = ws_set_header_ext(l,n,v,true);
  return iVar1;
}

Assistant:

static int
ws_set_header(nni_list *l, const char *n, const char *v)
{
	return (ws_set_header_ext(l, n, v, true));
}